

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int pk_get_rsapubkey(uchar **p,uchar *end,mbedtls_rsa_context *rsa)

{
  int iVar1;
  size_t len;
  
  iVar1 = mbedtls_asn1_get_tag(p,end,&len,0x30);
  if (iVar1 == 0) {
    if (*p + len != end) {
      return -0x3b66;
    }
    iVar1 = mbedtls_asn1_get_tag(p,end,&len,2);
    if (iVar1 == 0) {
      iVar1 = mbedtls_rsa_import_raw
                        (rsa,*p,len,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0);
      if (iVar1 != 0) {
        return -0x3b00;
      }
      *p = *p + len;
      iVar1 = mbedtls_asn1_get_tag(p,end,&len,2);
      if (iVar1 != 0) {
        return iVar1 + -0x3b00;
      }
      iVar1 = mbedtls_rsa_import_raw
                        (rsa,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,*p,len);
      if (iVar1 != 0) {
        return -0x3b00;
      }
      *p = *p + len;
      iVar1 = mbedtls_rsa_complete(rsa);
      if (iVar1 != 0) {
        return -0x3b00;
      }
      iVar1 = mbedtls_rsa_check_pubkey(rsa);
      if (iVar1 != 0) {
        return -0x3b00;
      }
      if (*p != end) {
        return -0x3b66;
      }
      return 0;
    }
  }
  return iVar1 + -0x3b00;
}

Assistant:

static int pk_get_rsapubkey( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_rsa_context *rsa )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( *p + len != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    /* Import N */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( ( ret = mbedtls_rsa_import_raw( rsa, *p, len, NULL, 0, NULL, 0,
                                        NULL, 0, NULL, 0 ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );

    *p += len;

    /* Import E */
    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY + ret );

    if( ( ret = mbedtls_rsa_import_raw( rsa, NULL, 0, NULL, 0, NULL, 0,
                                        NULL, 0, *p, len ) ) != 0 )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );

    *p += len;

    if( mbedtls_rsa_complete( rsa ) != 0 ||
        mbedtls_rsa_check_pubkey( rsa ) != 0 )
    {
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY );
    }

    if( *p != end )
        return( MBEDTLS_ERR_PK_INVALID_PUBKEY +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}